

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::syslog_log(void *param_1,Message *message)

{
  int local_1c;
  int level;
  Message *message_local;
  void *param_0_local;
  
  if (message->verbosity < -3) {
    local_1c = 1;
  }
  else {
    switch(message->verbosity) {
    case 0:
      local_1c = 5;
      break;
    case 1:
      local_1c = 6;
      break;
    case -3:
      local_1c = 2;
      break;
    case -2:
      local_1c = 3;
      break;
    case -1:
      local_1c = 4;
      break;
    default:
      local_1c = 7;
    }
  }
  syslog(local_1c,"%s%s%s",message->indentation,message->prefix,message->message);
  return;
}

Assistant:

void syslog_log(void* /*user_data*/, const Message& message)
	{
		/*
			Level 0: Is reserved for kernel panic type situations.
			Level 1: Is for Major resource failure.
			Level 2->7 Application level failures
		*/
		int level;
		if (message.verbosity < Verbosity_FATAL) {
			level = 1; // System Alert
		} else {
			switch(message.verbosity) {
				case Verbosity_FATAL:   level = 2; break;	// System Critical
				case Verbosity_ERROR:   level = 3; break;	// System Error
				case Verbosity_WARNING: level = 4; break;	// System Warning
				case Verbosity_INFO:    level = 5; break;	// System Notice
				case Verbosity_1:       level = 6; break;	// System Info
				default:                level = 7; break;	// System Debug
			}
		}

		// Note: We don't add the time info.
		// This is done automatically by the syslog deamon.
		// Otherwise log all information that the file log does.
		syslog(level, "%s%s%s", message.indentation, message.prefix, message.message);
	}